

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O0

void objindx(mcmcxdef *mctx,objnum objn)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  byte *pbVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  ushort in_SI;
  undefined8 *in_RDI;
  uint ofs;
  ushort need;
  uint cur;
  uint last;
  uint first;
  uint icnt;
  uchar *indbase;
  uchar *indp;
  prpdef *p;
  uint cnt;
  objdef *objptr;
  uint avail;
  uint newsiz;
  mcmcxdef *in_stack_ffffffffffffff70;
  undefined5 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7d;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  bool bVar8;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  byte *local_38;
  byte *local_30;
  uint local_24;
  uchar *local_20;
  
  local_20 = mcmlck((mcmcxdef *)
                    CONCAT17(in_stack_ffffffffffffff7f,
                             CONCAT16(in_stack_ffffffffffffff7e,
                                      CONCAT15(in_stack_ffffffffffffff7d,in_stack_ffffffffffffff78))
                            ),(mcmon)((ulong)in_stack_ffffffffffffff70 >> 0x30));
  local_24 = osrp2(local_20 + 6);
  local_24 = local_24 & 0xffff;
  uVar5 = osrp2(local_20 + 4);
  local_30 = local_20 + (long)(int)((uVar5 & 0xffff) << 1) + 0xe;
  uVar1 = *(ushort *)
           (*(long *)(*(long *)*in_RDI +
                     (long)((int)(uint)*(ushort *)
                                        (in_RDI[(long)((int)(uint)in_SI >> 8) + 6] +
                                        (long)(int)(in_SI & 0xff) * 2) >> 8) * 8) +
            (long)(int)(*(ushort *)
                         (in_RDI[(long)((int)(uint)in_SI >> 8) + 6] + (long)(int)(in_SI & 0xff) * 2)
                       & 0xff) * 0x20 + 0x18);
  uVar5 = osrp2(local_20 + 8);
  if ((uint)uVar1 - (uVar5 & 0xffff) < local_24 * 4 + 2) {
    local_20 = objexp((mcmcxdef *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      CONCAT11(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff7e),
                      (ushort *)in_stack_ffffffffffffff70);
    uVar5 = osrp2(local_20 + 4);
    local_30 = local_20 + (long)(int)((uVar5 & 0xffff) << 1) + 0xe;
  }
  uVar5 = osrp2(local_20 + 8);
  local_44 = 0;
  do {
    if (local_24 == 0) {
      uVar5 = osrp2(local_20 + 2);
      oswp2(local_20 + 2,uVar5 & 0xffff | 2);
      lVar7 = *(long *)(*(long *)*in_RDI +
                       (long)((int)(uint)*(ushort *)
                                          (in_RDI[(long)((int)(uint)in_SI >> 8) + 6] +
                                          (long)(int)(in_SI & 0xff) * 2) >> 8) * 8) +
              (long)(int)(*(ushort *)
                           (in_RDI[(long)((int)(uint)in_SI >> 8) + 6] +
                           (long)(int)(in_SI & 0xff) * 2) & 0xff) * 0x20;
      *(ushort *)(lVar7 + 0x14) = *(ushort *)(lVar7 + 0x14) | 1;
      mcmunlck(in_stack_ffffffffffffff70,(mcmon)((ulong)(local_20 + 2) >> 0x30));
      return;
    }
    pbVar4 = local_20 + (int)(uVar5 & 0xffff);
    if (local_44 != 0) {
      local_48 = 0;
      uVar2 = local_44 - 1;
      uVar3 = local_48;
      while (local_48 = uVar3, local_4c = uVar2, local_48 <= local_4c) {
        local_50 = local_48 + (local_4c - local_48 >> 1);
        local_38 = local_20 + (int)(uVar5 & 0xffff) + local_50 * 4;
        if ((*local_38 == *local_30) && (local_38[1] == local_30[1])) break;
        if ((*local_38 < *local_30) || ((*local_38 == *local_30 && (local_38[1] < local_30[1])))) {
          uVar2 = local_4c;
          uVar3 = local_50;
          if (local_50 == local_48) {
            uVar3 = local_48 + 1;
          }
        }
        else {
          uVar2 = local_50;
          uVar3 = local_48;
          if (local_50 == local_4c) {
            uVar2 = local_4c - 1;
          }
        }
      }
      while( true ) {
        bVar8 = false;
        if (((local_50 < local_44) && (bVar8 = true, *local_30 < *local_38)) &&
           (bVar8 = false, *local_38 == *local_30)) {
          bVar8 = local_38[1] <= local_30[1];
        }
        if (!bVar8) break;
        local_38 = local_38 + 4;
        local_50 = local_50 + 1;
      }
      pbVar4 = local_38;
      if (local_50 < local_44) {
        memmove(local_38 + 4,local_38,(ulong)((local_44 - local_50) * 4));
      }
    }
    local_38 = pbVar4;
    *local_38 = *local_30;
    local_38[1] = local_30[1];
    oswp2(local_38 + 2,(int)local_30 - (int)local_20);
    in_stack_ffffffffffffff70 = (mcmcxdef *)(local_30 + 6);
    iVar6 = osrp2(local_30 + 3);
    local_30 = (byte *)((long)in_stack_ffffffffffffff70->mcmcxmtb + (long)iVar6 + -0x30);
    local_24 = local_24 - 1;
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

void objindx(mcmcxdef *mctx, objnum objn)
{
    uint    newsiz;
    uint    avail;
    objdef *objptr;
    uint    cnt;
    prpdef *p;
    uchar  *indp;
    uchar  *indbase;
    uint    icnt;
    uint    first;
    uint    last;
    uint    cur;
    
    objptr = (objdef *)mcmlck(mctx, objn);            /* get object pointer */
    cnt = objnprop(objptr);                     /* get number of properties */
    p = objprp(objptr);         /* get pointer to properties (or old index) */
    newsiz = 2 + 4*cnt;                 /* figure size needed for the index */
    
    avail = mcmobjsiz(mctx, objn) - objfree(objptr);
    
    /* insert space for the index; expand the object if necessary */
    if (avail < newsiz)
    {
        ushort  need;
        
        newsiz += 10*4;                   /* add some extra space for later */
        need = newsiz - avail;            /* compute amount of space needed */
        objptr = objexp(mctx, objn, &need);
        p = objprp(objptr);
    }
    
    /* now build the index */
    indbase = objpfre(objptr);
    for (icnt = 0 ; cnt ; p = objpnxt(p), --cnt, ++icnt)
    {
        uint ofs = (uchar *)p - (uchar *)objptr;
        
        if (icnt)
        {
            /* figure out where to insert this property */
            first = 0;
            last = icnt - 1;
            for (;;)
            {
                if (first > last) break;
                cur = first + (last - first)/2;
                indp = indbase + cur*4;
                if (indp[0] == p[0] && indp[1] == p[1])
                    break;
                else if (indp[0] < p[0]
                         || (indp[0] == p[0] && indp[1] < p[1]))
                    first = (cur == first ? first + 1 : cur);
                else
                    last = (cur == last ? last - 1 : cur);
            }
            
            /* make sure we're positioned just before insertion point */
            while (cur < icnt
                   && (indp[0] <= p[0]
                       || (indp[0] == p[0] && indp[1] <= p[1])))
            {
                indp += 4;
                ++cur;
            }
                
            /* move elements above if any */
            if (cur < icnt)
                memmove(indp + 4, indp, (size_t)((icnt - cur) * 4));
        }
        else
            indp = indbase;
        
        /* insert property into index */
        indp[0] = p[0];
        indp[1] = p[1];
        oswp2(indp+2, ofs);
    }
    
    /* set the index flag, and dirty and free the object */
    objsflg(objptr, objflg(objptr) | OBJFINDEX);
    mcmtch(mctx, (mcmon)objn);
    mcmunlck(mctx, (mcmon)objn);
}